

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_offsetsurface.cpp
# Opt level: O1

void __thiscall ON_OffsetSurfaceFunction::Destroy(ON_OffsetSurfaceFunction *this)

{
  double dVar1;
  
  this->m_srf = (ON_Surface *)0x0;
  this->m_bZeroSideDerivative[0] = false;
  dVar1 = ON_Interval::EmptyInterval.m_t[1];
  this->m_bZeroSideDerivative[1] = false;
  this->m_bZeroSideDerivative[2] = false;
  this->m_bZeroSideDerivative[3] = false;
  *(double *)&this->field_0x8 = ON_Interval::EmptyInterval.m_t[0];
  *(double *)&this->field_0x10 = dVar1;
  dVar1 = ON_Interval::EmptyInterval.m_t[1];
  *(double *)&this->field_0x18 = ON_Interval::EmptyInterval.m_t[0];
  *(double *)&this->field_0x20 = dVar1;
  if (-1 < (this->m_bumps).m_capacity) {
    (this->m_bumps).m_count = 0;
  }
  this->m_bValid = false;
  return;
}

Assistant:

void ON_OffsetSurfaceFunction::Destroy()
{
  m_srf = 0;
  m_bZeroSideDerivative[0] = false;
  m_bZeroSideDerivative[1] = false;
  m_bZeroSideDerivative[2] = false;
  m_bZeroSideDerivative[3] = false;

  m_domain[0] = ON_Interval::EmptyInterval;
  m_domain[1] = ON_Interval::EmptyInterval;
  m_bumps.SetCount(0);
  m_bValid = false;
}